

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseCompiler::newVirtReg
          (BaseCompiler *this,VirtReg **out,TypeId typeId,OperandSignature signature,char *name)

{
  VirtReg VVar1;
  uint32_t uVar2;
  Error EVar3;
  uint uVar4;
  RegOnly in_RAX;
  VirtReg *vReg;
  char *name_00;
  VirtReg VVar5;
  TypeId typeId_00;
  VirtReg *zone;
  uint32_t *puVar6;
  BaseCompiler *this_00;
  BaseCompiler *this_01;
  TypeId TStack_b5;
  OperandSignature OStack_b4;
  VirtReg *pVStack_b0;
  VirtReg *pVStack_a8;
  BaseCompiler *pBStack_a0;
  code *pcStack_98;
  undefined1 auStack_90 [80];
  undefined8 uStack_40;
  RegOnly local_38;
  
  *out = (VirtReg *)0x0;
  uVar4 = *(uint *)&this->field_0x1f0;
  local_38 = in_RAX;
  if (0xfffffefe < uVar4) {
    EVar3 = 0x3f;
    goto LAB_0011af03;
  }
  if (*(uint *)&this->field_0x1f4 == uVar4) {
    uStack_40._0_4_ = 0x11adfa;
    uStack_40._4_4_ = kNone;
    EVar3 = ZoneVectorBase::_grow
                      ((ZoneVectorBase *)&this->_vRegArray,&(this->super_BaseBuilder)._allocator,8,1
                      );
    if (EVar3 == 0) goto LAB_0011ae02;
  }
  else {
LAB_0011ae02:
    uStack_40._0_4_ = 0x11ae1c;
    uStack_40._4_4_ = kNone;
    local_38 = (RegOnly)out;
    vReg = (VirtReg *)Zone::allocZeroed(&this->_vRegZone,0x30,8);
    if (vReg != (VirtReg *)0x0) {
      VVar1 = *(VirtReg *)(TypeUtils::_typeData + (ulong)typeId + 0x100);
      VVar5 = (VirtReg)0x40;
      if ((byte)VVar1 < 0x40) {
        VVar5 = VVar1;
      }
      *(uint32_t *)vReg = signature._bits;
      *(uint *)(vReg + 4) = uVar4 + 0x100;
      *(uint *)(vReg + 8) = (uint)(byte)VVar1;
      vReg[0xc] = VVar5;
      vReg[0xd] = (VirtReg)typeId;
      vReg[0xe] = (VirtReg)0x1;
      *(undefined8 *)(vReg + 0xf) = 0;
      *(undefined8 *)(vReg + 0x17) = 0;
      *(undefined8 *)(vReg + 0x1f) = 0;
      *(undefined8 *)(vReg + 0x27) = 0;
      vReg[0x2f] = (VirtReg)0x0;
      if ((name == (char *)0x0) || (*name == '\0')) {
        uStack_40._0_4_ = 0x11ae96;
        uStack_40._4_4_ = kNone;
        zone = vReg;
        this_00 = this;
        BaseCompiler_assignGenericName(this,vReg);
      }
      else {
        this_00 = (BaseCompiler *)(vReg + 0x18);
        zone = (VirtReg *)&(this->super_BaseBuilder)._dataZone;
        uStack_40._0_4_ = 0x11aeef;
        uStack_40._4_4_ = kNone;
        ZoneStringBase::setData((ZoneStringBase *)this_00,(Zone *)zone,0xb,name,0xffffffffffffffff);
      }
      if (*(uint *)&this->field_0x1f0 < *(uint *)&this->field_0x1f4) {
        *(VirtReg **)(*(long *)&this->_vRegArray + (ulong)*(uint *)&this->field_0x1f0 * 8) = vReg;
        *(int *)&this->field_0x1f0 = *(int *)&this->field_0x1f0 + 1;
        *(VirtReg **)local_38 = vReg;
        return 0;
      }
      uStack_40 = BaseCompiler_assignGenericName;
      newVirtReg();
      this_01 = (BaseCompiler *)auStack_90;
      puVar6 = (uint32_t *)0x40;
      pcStack_98 = (code *)0x11af48;
      auStack_90._72_8_ = this;
      uStack_40 = (code *)(ulong)(uVar4 + 0x100);
      uVar4 = snprintf(auStack_90,0x40,"%%%u",(ulong)(*(int *)(zone + 4) - 0x100));
      name_00 = (char *)(ulong)(uVar4 - 1);
      if (uVar4 - 1 < 0x3f) {
        pcStack_98 = (code *)0x11af71;
        EVar3 = ZoneStringBase::setData
                          ((ZoneStringBase *)(zone + 0x18),&(this_00->super_BaseBuilder)._dataZone,
                           0xb,auStack_90,(ulong)uVar4);
        return EVar3;
      }
      pcStack_98 = _newReg;
      BaseCompiler_assignGenericName();
      puVar6[0] = 0;
      puVar6[1] = 0;
      puVar6[2] = 0;
      puVar6[3] = 0;
      TStack_b5 = typeId_00;
      pVStack_a8 = zone;
      pBStack_a0 = this_00;
      pcStack_98 = (code *)name;
      EVar3 = ArchUtils::typeIdToRegSignature
                        ((this_01->super_BaseBuilder).super_BaseEmitter._environment._arch,typeId_00
                         ,&TStack_b5,&OStack_b4);
      if (EVar3 == 0) {
        EVar3 = newVirtReg(this_01,&pVStack_b0,TStack_b5,OStack_b4,name_00);
        if (EVar3 == 0) {
          uVar2 = *(uint32_t *)(pVStack_b0 + 4);
          *puVar6 = OStack_b4._bits;
          puVar6[1] = uVar2;
          puVar6[2] = 0;
          puVar6[3] = 0;
          EVar3 = 0;
        }
      }
      else {
        EVar3 = BaseEmitter::reportError((BaseEmitter *)this_01,EVar3,(char *)0x0);
      }
      return EVar3;
    }
  }
  EVar3 = 1;
LAB_0011af03:
  EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EVar3,(char *)0x0);
  return EVar3;
}

Assistant:

Error BaseCompiler::newVirtReg(VirtReg** out, TypeId typeId, OperandSignature signature, const char* name) {
  *out = nullptr;
  uint32_t index = _vRegArray.size();

  if (ASMJIT_UNLIKELY(index >= uint32_t(Operand::kVirtIdCount)))
    return reportError(DebugUtils::errored(kErrorTooManyVirtRegs));

  if (ASMJIT_UNLIKELY(_vRegArray.willGrow(&_allocator) != kErrorOk))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  VirtReg* vReg = _vRegZone.allocZeroedT<VirtReg>();
  if (ASMJIT_UNLIKELY(!vReg))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  uint32_t size = TypeUtils::sizeOf(typeId);
  uint32_t alignment = Support::min<uint32_t>(size, 64);

  vReg = new(Support::PlacementNew{vReg}) VirtReg(signature, Operand::indexToVirtId(index), size, alignment, typeId);

#ifndef ASMJIT_NO_LOGGING
  if (name && name[0] != '\0')
    vReg->_name.setData(&_dataZone, name, SIZE_MAX);
  else
    BaseCompiler_assignGenericName(this, vReg);
#else
  DebugUtils::unused(name);
#endif

  _vRegArray.appendUnsafe(vReg);
  *out = vReg;

  return kErrorOk;
}